

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::Int64Option::help(Int64Option *this,bool verbose)

{
  fprintf(_stderr,"  -%-12s = %-8s [",(this->super_Option).name,(this->super_Option).type_name);
  if ((this->range).begin == -0x8000000000000000) {
    fwrite("imin",4,1,_stderr);
  }
  else {
    fprintf(_stderr,"%4li");
  }
  fwrite(" .. ",4,1,_stderr);
  if ((this->range).end == 0x7fffffffffffffff) {
    fwrite("imax",4,1,_stderr);
  }
  else {
    fprintf(_stderr,"%4li");
  }
  fprintf(_stderr,"] (default: %li)\n",this->value);
  if (!verbose) {
    return;
  }
  fprintf(_stderr,"\n        %s\n",(this->super_Option).description);
  fputc(10,_stderr);
  return;
}

Assistant:

virtual void help(bool verbose = false)
    {
        fprintf(stderr, "  -%-12s = %-8s [", name, type_name);
        if (range.begin == INT64_MIN)
            fprintf(stderr, "imin");
        else
            fprintf(stderr, "%4" PRIi64, range.begin);

        fprintf(stderr, " .. ");
        if (range.end == INT64_MAX)
            fprintf(stderr, "imax");
        else
            fprintf(stderr, "%4" PRIi64, range.end);

        fprintf(stderr, "] (default: %" PRIi64 ")\n", value);
        if (verbose) {
            fprintf(stderr, "\n        %s\n", description);
            fprintf(stderr, "\n");
        }
    }